

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predictor_enc.c
# Opt level: O0

float GetPredictionCostCrossColorRed
                (uint32_t *argb,int stride,int tile_width,int tile_height,VP8LMultipliers prev_x,
                VP8LMultipliers prev_y,int green_to_red,int *accumulated_red_histo)

{
  int in_ECX;
  int in_EDX;
  int in_ESI;
  uint32_t *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  float fVar1;
  uint in_stack_00000008;
  float cur_diff;
  int histo [256];
  int *in_stack_fffffffffffffbc8;
  undefined4 in_stack_fffffffffffffbd0;
  undefined4 in_stack_fffffffffffffbd4;
  int local_428 [259];
  int local_1c;
  int local_18;
  int local_14;
  uint32_t *local_10;
  undefined2 local_6;
  undefined1 local_4;
  undefined2 local_3;
  undefined1 local_1;
  
  local_3 = (undefined2)in_R8D;
  local_1 = (undefined1)((uint)in_R8D >> 0x10);
  local_4 = (undefined1)((uint)in_R9D >> 0x10);
  local_6 = (undefined2)in_R9D;
  local_1c = in_ECX;
  local_18 = in_EDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  memset(local_428,0,0x400);
  (*VP8LCollectColorRedTransforms)(local_10,local_14,local_18,local_1c,in_stack_00000008,local_428);
  fVar1 = PredictionCostCrossColor
                    ((int *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                     in_stack_fffffffffffffbc8);
  if ((in_stack_00000008 & 0xff) == (uint)(byte)local_3) {
    fVar1 = fVar1 - 3.0;
  }
  if ((in_stack_00000008 & 0xff) == (uint)(byte)local_6) {
    fVar1 = fVar1 - 3.0;
  }
  if (in_stack_00000008 == 0) {
    fVar1 = fVar1 - 3.0;
  }
  return fVar1;
}

Assistant:

static float GetPredictionCostCrossColorRed(
    const uint32_t* argb, int stride, int tile_width, int tile_height,
    VP8LMultipliers prev_x, VP8LMultipliers prev_y, int green_to_red,
    const int accumulated_red_histo[256]) {
  int histo[256] = { 0 };
  float cur_diff;

  VP8LCollectColorRedTransforms(argb, stride, tile_width, tile_height,
                                green_to_red, histo);

  cur_diff = PredictionCostCrossColor(accumulated_red_histo, histo);
  if ((uint8_t)green_to_red == prev_x.green_to_red_) {
    cur_diff -= 3;  // favor keeping the areas locally similar
  }
  if ((uint8_t)green_to_red == prev_y.green_to_red_) {
    cur_diff -= 3;  // favor keeping the areas locally similar
  }
  if (green_to_red == 0) {
    cur_diff -= 3;
  }
  return cur_diff;
}